

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::CreateIfNotCreatedAlready(Session *this)

{
  long lVar1;
  Sock *pSVar2;
  pointer puVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  char *args;
  Level LVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string in_stack_fffffffffffffe18;
  undefined1 local_1c8 [8];
  char *session_type;
  Reply local_198;
  string local_120;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [6];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> session_id;
  string errmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pSVar2 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  if (pSVar2 != (Sock *)0x0) {
    iVar6 = (*pSVar2->_vptr_Sock[0x13])(pSVar2,&errmsg);
    if ((char)iVar6 != '\0') goto LAB_006d4ebb;
  }
  session_type = "persistent";
  if (this->m_transient != false) {
    session_type = "transient";
  }
  GetRandHash();
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_100,(base_blob<256u> *)&local_88);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  args = (char *)0xa;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&session_id,pbVar8,0,10);
  LVar7 = (Level)pbVar8;
  std::__cxx11::string::~string((string *)local_100);
  bVar5 = ::LogAcceptCategory(NET,LVar7);
  if (bVar5) {
    Proxy::ToString_abi_cxx11_((string *)local_100,&this->m_control_host);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a1;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp";
    source_file._M_len = 0x57;
    args = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
    ;
    logging_function._M_str = "CreateIfNotCreatedAlready";
    logging_function._M_len = 0x19;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x1a1,I2P,Debug,(ConstevalFormatString<3U>)0xc8eca9,
               &session_type,&session_id,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
  }
  Hello((Session *)local_1c8);
  auVar4 = local_1c8;
  if (this->m_transient == true) {
    tinyformat::format<std::__cxx11::string>
              (&local_88,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1"
               ,(char *)&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    SendRequestAndGetReply((Reply *)local_100,this,(Sock *)auVar4,&local_88,true);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"DESTINATION",(allocator<char> *)&stack0xfffffffffffffe1f);
    Reply::Get(&local_88,(Reply *)local_100,&local_120);
    DecodeI2PBase64((Binary *)&stack0xfffffffffffffe20,&local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->m_private_key,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xfffffffffffffe20);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xfffffffffffffe20);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_120);
    Reply::~Reply((Reply *)local_100);
  }
  else {
    ReadBinaryFile_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_100,&this->m_private_key_file,0xffffffffffffffff);
    if ((string)local_100[0] == (string)0x1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_private_key,
                 local_100._8_8_,local_f0[0]._M_allocated_capacity + local_100._8_8_);
    }
    else {
      GenerateAndSavePrivateKey(this,(Sock *)local_1c8);
    }
    puVar3 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    input.m_size = (long)(this->m_private_key).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3;
    input.m_data = puVar3;
    EncodeBase64_abi_cxx11_(&local_120,input);
    SwapBase64(&local_88,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    auVar4 = local_1c8;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_120,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3"
               ,(char *)&session_id,&local_88,in_R8);
    SendRequestAndGetReply(&local_198,this,(Sock *)auVar4,&local_120,true);
    Reply::~Reply(&local_198);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)(local_100 + 8));
  }
  MyDestination((Binary *)&local_120,this);
  DestBinToAddr((CNetAddr *)&local_88,(Binary *)&local_120);
  CService::CService((CService *)local_100,(CNetAddr *)&local_88,0);
  CService::operator=(&this->m_my_addr,(CService *)local_100);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_100);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
  pbVar8 = &session_id;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_session_id,pbVar8);
  auVar4 = local_1c8;
  LVar7 = (Level)pbVar8;
  local_1c8 = (undefined1  [8])0x0;
  pSVar2 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)auVar4;
  if (pSVar2 != (Sock *)0x0) {
    (*pSVar2->_vptr_Sock[1])();
  }
  bVar5 = ::LogAcceptCategory(TOR,LVar7);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe48,session_type,(allocator<char> *)&local_120);
    Capitalize((string *)local_100,in_stack_fffffffffffffe18);
    CService::ToStringAddrPort_abi_cxx11_(&local_88,&this->m_my_addr);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "CreateIfNotCreatedAlready";
    logging_function_00._M_len = 0x19;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (logging_function_00,source_file_00,0x1c9,I2P,Info,(ConstevalFormatString<3U>)0xc8edd3
               ,(string *)local_100,&this->m_session_id,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  }
  if (local_1c8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1c8 + 8))();
  }
  std::__cxx11::string::~string((string *)&session_id);
LAB_006d4ebb:
  std::__cxx11::string::~string((string *)&errmsg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::CreateIfNotCreatedAlready()
{
    std::string errmsg;
    if (m_control_sock && m_control_sock->IsConnected(errmsg)) {
        return;
    }

    const auto session_type = m_transient ? "transient" : "persistent";
    const auto session_id = GetRandHash().GetHex().substr(0, 10); // full is overkill, too verbose in the logs

    LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Creating %s SAM session %s with %s\n", session_type, session_id, m_control_host.ToString());

    auto sock = Hello();

    if (m_transient) {
        // The destination (private key) is generated upon session creation and returned
        // in the reply in DESTINATION=.
        const Reply& reply = SendRequestAndGetReply(
            *sock,
            strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 "
                      "i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1",
                      session_id));

        m_private_key = DecodeI2PBase64(reply.Get("DESTINATION"));
    } else {
        // Read our persistent destination (private key) from disk or generate
        // one and save it to disk. Then use it when creating the session.
        const auto& [read_ok, data] = ReadBinaryFile(m_private_key_file);
        if (read_ok) {
            m_private_key.assign(data.begin(), data.end());
        } else {
            GenerateAndSavePrivateKey(*sock);
        }

        const std::string& private_key_b64 = SwapBase64(EncodeBase64(m_private_key));

        SendRequestAndGetReply(*sock,
                               strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s "
                                         "i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3",
                                         session_id,
                                         private_key_b64));
    }

    m_my_addr = CService(DestBinToAddr(MyDestination()), I2P_SAM31_PORT);
    m_session_id = session_id;
    m_control_sock = std::move(sock);

    LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "%s SAM session %s created, my address=%s\n",
        Capitalize(session_type),
        m_session_id,
        m_my_addr.ToStringAddrPort());
}